

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallTargetGenerator::AddUniversalInstallRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmTarget *this_00;
  bool bVar2;
  TargetType TVar3;
  cmMakefile *this_01;
  cmValue rhs;
  string *psVar4;
  ostream *poVar5;
  Indent IVar6;
  string local_58;
  string *local_38;
  
  local_38 = toDestDirPath;
  this_01 = cmTarget::GetMakefile(this->Target->Target);
  bVar2 = cmMakefile::PlatformIsAppleEmbedded(this_01);
  if (bVar2) {
    paVar1 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"XCODE","");
    bVar2 = cmMakefile::IsOn(this_01,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"XCODE_VERSION","");
      rhs = cmMakefile::GetDefinition(this_01,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (rhs.Value != (string *)0x0) {
        local_58._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"6","");
        bVar2 = cmSystemTools::VersionCompareGreater(&local_58,rhs.Value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar1) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((!bVar2) && (TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 < OBJECT_LIBRARY))
        {
          this_00 = this->Target->Target;
          local_58._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"IOS_INSTALL_COMBINED","");
          bVar2 = cmTarget::GetPropertyAsBool(this_00,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar1) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if (bVar2) {
            IVar6.Level = indent.Level;
            if (indent.Level < 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (os,"include(CMakeIOSInstallCombined)\n",0x21);
            }
            else {
              do {
                std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
                IVar6.Level = IVar6.Level + -1;
              } while (IVar6.Level != 0);
              std::__ostream_insert<char,std::char_traits<char>>
                        (os,"include(CMakeIOSInstallCombined)\n",0x21);
              do {
                std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
                indent.Level = indent.Level + -1;
              } while (indent.Level != 0);
            }
            std::__ostream_insert<char,std::char_traits<char>>(os,"ios_install_combined(",0x15);
            std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
            psVar4 = cmTarget::GetName_abi_cxx11_(this->Target->Target);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (os,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(local_38->_M_dataplus)._M_p,local_38->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddUniversalInstallRule(
  std::ostream& os, Indent indent, const std::string& toDestDirPath)
{
  cmMakefile const* mf = this->Target->Target->GetMakefile();

  if (!mf->PlatformIsAppleEmbedded() || !mf->IsOn("XCODE")) {
    return;
  }

  cmValue xcodeVersion = mf->GetDefinition("XCODE_VERSION");
  if (!xcodeVersion ||
      cmSystemTools::VersionCompareGreater("6", *xcodeVersion)) {
    return;
  }

  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      break;

    default:
      return;
  }

  if (!this->Target->Target->GetPropertyAsBool("IOS_INSTALL_COMBINED")) {
    return;
  }

  os << indent << "include(CMakeIOSInstallCombined)\n";
  os << indent << "ios_install_combined("
     << "\"" << this->Target->Target->GetName() << "\" "
     << "\"" << toDestDirPath << "\")\n";
}